

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

string * __thiscall
pbrt::MLTSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,MLTSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::RNG_const&,float_const&,float_const&,int_const&,pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
            (__return_storage_ptr__,
             "[ MLTSampler rng: %s sigma: %f largeStepProbability: %f streamCount: %d X: %s currentIteration: %d largeStep: %s lastLargeStepIteration: %d streamIndex: %d sampleIndex: %d ] "
             ,&this->rng,&this->sigma,&this->largeStepProbability,&this->streamCount,&this->X,
             &this->currentIteration,&this->largeStep,&this->lastLargeStepIteration,
             &this->streamIndex,&this->sampleIndex);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ MLTSampler rng: %s sigma: %f largeStepProbability: %f "
            "streamCount: %d X: %s currentIteration: %d largeStep: %s "
            "lastLargeStepIteration: %d streamIndex: %d sampleIndex: %d ] ",
            rng, sigma, largeStepProbability, streamCount, X, currentIteration, largeStep,
            lastLargeStepIteration, streamIndex, sampleIndex);
    }